

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanupFallback
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  CleanupNode *pCVar2;
  SerialArena *this_00;
  char *elem;
  char *failure_msg;
  void *pvVar3;
  CleanupNode *pCVar4;
  __pointer_type pAVar5;
  int line;
  __pointer_type pAVar6;
  CleanupNode *pCVar7;
  ulong n_00;
  LogMessageFatal local_40;
  
  this_00 = GetSerialArenaFallback(this,n + 0x10);
  n_00 = n + 7 & 0xfffffffffffffff8;
  local_40.super_LogMessage._0_8_ = ArenaAlignAs(align);
  elem = ArenaAlign::CeilDefaultAligned<char>((ArenaAlign *)&local_40,(this_00->ptr_)._M_b._M_p);
  pAVar1 = (__pointer_type)(elem + n_00);
  if ((__pointer_type)this_00->limit_ < pAVar1) {
    pvVar3 = SerialArena::AllocateAlignedWithCleanupFallback(this_00,n_00,align,destructor);
    return pvVar3;
  }
  (this_00->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar4 = (this_00->cleanup_list_).next_;
  if (pCVar4 < (this_00->cleanup_list_).limit_) {
    (this_00->cleanup_list_).next_ = pCVar4 + 1;
    pCVar4->elem = elem;
    pCVar4->destructor = destructor;
  }
  else {
    cleanup::ChunkList::AddFallback(&this_00->cleanup_list_,elem,destructor,this_00);
  }
  pCVar4 = (CleanupNode *)(this_00->cleanup_list_).prefetch_ptr_;
  if ((pCVar4 != (CleanupNode *)0x0) && (pCVar4 < (CleanupNode *)(this_00->cleanup_list_).head_)) {
    failure_msg = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    line = 0x136;
    goto LAB_001b6d73;
  }
  pCVar2 = (this_00->cleanup_list_).next_;
  if (((long)pCVar4 - (long)pCVar2 < 0x181) &&
     (pCVar7 = (this_00->cleanup_list_).limit_, pCVar4 < pCVar7)) {
    if (pCVar2 < pCVar4) {
      pCVar2 = pCVar4;
    }
    pCVar4 = pCVar2;
    if (pCVar4 != (CleanupNode *)0x0) {
      if (pCVar4 + 0x18 < pCVar7) {
        pCVar7 = pCVar4 + 0x18;
      }
      for (; pCVar4 < pCVar7; pCVar4 = pCVar4 + 4) {
      }
      goto LAB_001b6c1d;
    }
  }
  else {
LAB_001b6c1d:
    (this_00->cleanup_list_).prefetch_ptr_ = (char *)pCVar4;
    local_40.super_LogMessage._0_8_ = (this_00->ptr_)._M_b._M_p;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<char*,char*>
                            (&this_00->limit_,(char **)&local_40,"limit_ >= ptr()");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      line = 0xf2;
      goto LAB_001b6d73;
    }
    pAVar6 = (__pointer_type)this_00->prefetch_ptr_;
    if ((pAVar6 != (__pointer_type)0x0) && (pAVar6 < (this_00->head_)._M_b._M_p)) {
      failure_msg = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      line = 0x12d;
      goto LAB_001b6d73;
    }
    if ((0x400 < (long)pAVar6 - (long)pAVar1) ||
       (pAVar5 = (__pointer_type)this_00->limit_, pAVar5 <= pAVar6)) {
LAB_001b6c74:
      this_00->prefetch_ptr_ = (char *)pAVar6;
      return elem;
    }
    if (pAVar1 < pAVar6) {
      pAVar1 = pAVar6;
    }
    pAVar6 = pAVar1;
    if (pAVar6 != (__pointer_type)0x0) {
      if (pAVar6 + 0x40 < pAVar5) {
        pAVar5 = pAVar6 + 0x40;
      }
      for (; pAVar6 < pAVar5; pAVar6 = pAVar6 + 4) {
      }
      goto LAB_001b6c74;
    }
  }
  failure_msg = "prefetch_ptr != nullptr";
  line = 0x122;
LAB_001b6d73:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

PROTOBUF_NOINLINE
void* ThreadSafeArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  return GetSerialArenaFallback(n + kMaxCleanupNodeSize)
      ->AllocateAlignedWithCleanup(n, align, destructor);
}